

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O1

bool woff2::WriteTable(Table *table,size_t *offset,uint8_t *dst,size_t dst_size)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  
  bVar3 = WriteTableRecord(table,offset,dst,dst_size);
  if (bVar3) {
    if (table->reuse_of != (Table *)0x0) {
      return true;
    }
    uVar1 = table->offset;
    uVar2 = table->length;
    if (uVar2 + uVar1 <= dst_size && !CARRY4(uVar2,uVar1)) {
      memcpy(dst + uVar1,table->data,(ulong)uVar2);
      uVar1 = table->length;
      if ((ulong)(table->offset + uVar1) + (ulong)(-uVar1 & 3) <= dst_size) {
        memset(dst + (ulong)uVar1 + (ulong)table->offset,0,(ulong)(-uVar1 & 3));
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool WriteTable(const Font::Table& table, size_t* offset, uint8_t* dst,
                size_t dst_size) {
  if (!WriteTableRecord(&table, offset, dst, dst_size)) {
    return false;
  }

  // Write the actual table data if it's the first time we've seen it
  if (!table.IsReused()) {
    if (table.offset + table.length < table.offset ||
        dst_size < table.offset + table.length) {
      return FONT_COMPRESSION_FAILURE();
    }
    memcpy(dst + table.offset, table.data, table.length);
    size_t padding_size = (4 - (table.length & 3)) & 3;
    if (table.offset + table.length + padding_size < padding_size ||
        dst_size < table.offset + table.length + padding_size) {
      return FONT_COMPRESSION_FAILURE();
    }
    memset(dst + table.offset + table.length, 0, padding_size);
  }
  return true;
}